

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

LogicalType * duckdb::TransformStringToLogicalType(LogicalType *__return_storage_ptr__,string *str)

{
  ParserOptions options;
  bool bVar1;
  ColumnDefinition *this;
  LogicalType *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *suggestion;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  suggestions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  suggested_types;
  ostringstream error;
  ColumnList column_list;
  
  StringUtil::Lower((string *)&error,str);
  bVar1 = ::std::operator==((string *)&error,"null");
  ::std::__cxx11::string::~string((string *)&error);
  if (bVar1) {
    LogicalType::LogicalType(__return_storage_ptr__,SQLNULL);
  }
  else {
    ColumnList::ColumnList(&column_list,false);
    ::std::operator+(&local_6c8,"dummy ",str);
    options.max_expression_depth = 1000;
    options.preserve_identifier_case = true;
    options.integer_division = false;
    options._2_6_ = 0;
    options.extensions = (vector<duckdb::ParserExtension,_true> *)0x0;
    Parser::ParseColumnList((ColumnList *)&error,&local_6c8,options);
    ColumnList::operator=(&column_list,(ColumnList *)&error);
    ColumnList::~ColumnList((ColumnList *)&error);
    ::std::__cxx11::string::~string((string *)&local_6c8);
    this = ColumnList::GetColumn(&column_list,(LogicalIndex)0x0);
    other = ColumnDefinition::Type(this);
    LogicalType::LogicalType(__return_storage_ptr__,other);
    ColumnList::~ColumnList(&column_list);
  }
  return __return_storage_ptr__;
}

Assistant:

LogicalType TransformStringToLogicalType(const string &str) {
	if (StringUtil::Lower(str) == "null") {
		return LogicalType::SQLNULL;
	}
	ColumnList column_list;
	try {
		column_list = Parser::ParseColumnList("dummy " + str);
	} catch (const std::runtime_error &e) {
		const vector<string> suggested_types {"BIGINT",
		                                      "INT8",
		                                      "LONG",
		                                      "BIT",
		                                      "BITSTRING",
		                                      "BLOB",
		                                      "BYTEA",
		                                      "BINARY,",
		                                      "VARBINARY",
		                                      "BOOLEAN",
		                                      "BOOL",
		                                      "LOGICAL",
		                                      "DATE",
		                                      "DECIMAL(prec, scale)",
		                                      "DOUBLE",
		                                      "FLOAT8",
		                                      "FLOAT",
		                                      "FLOAT4",
		                                      "REAL",
		                                      "HUGEINT",
		                                      "INTEGER",
		                                      "INT4",
		                                      "INT",
		                                      "SIGNED",
		                                      "INTERVAL",
		                                      "SMALLINT",
		                                      "INT2",
		                                      "SHORT",
		                                      "TIME",
		                                      "TIMESTAMPTZ",
		                                      "TIMESTAMP",
		                                      "DATETIME",
		                                      "TINYINT",
		                                      "INT1",
		                                      "UBIGINT",
		                                      "UHUGEINT",
		                                      "UINTEGER",
		                                      "USMALLINT",
		                                      "UTINYINT",
		                                      "UUID",
		                                      "VARCHAR",
		                                      "CHAR",
		                                      "BPCHAR",
		                                      "TEXT",
		                                      "STRING",
		                                      "MAP(INTEGER, VARCHAR)",
		                                      "UNION(num INTEGER, text VARCHAR)"};
		std::ostringstream error;
		error << "Value \"" << str << "\" can not be converted to a DuckDB Type." << '\n';
		error << "Possible examples as suggestions: " << '\n';
		auto suggestions = StringUtil::TopNJaroWinkler(suggested_types, str);
		for (auto &suggestion : suggestions) {
			error << "* " << suggestion << '\n';
		}
		throw InvalidInputException(error.str());
	}
	return column_list.GetColumn(LogicalIndex(0)).Type();
}